

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

float * __thiscall cxxopts::OptionValue::as<float>(OptionValue *this)

{
  string *psVar1;
  long lVar2;
  float *pfVar3;
  element_type *peVar4;
  allocator<char> local_31;
  string local_30;
  
  peVar4 = (this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4 == (element_type *)0x0) {
    if (this->m_long_names == (OptionNames *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
    }
    else {
      psVar1 = first_or_empty(this->m_long_names);
      std::__cxx11::string::string((string *)&local_30,(string *)psVar1);
    }
    throw_or_mimic<cxxopts::exceptions::option_has_no_value>(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    peVar4 = (this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  lVar2 = __dynamic_cast(peVar4,&Value::typeinfo,&values::standard_value<float>::typeinfo,0);
  if (lVar2 != 0) {
    pfVar3 = *(float **)(lVar2 + 0x28);
    if (pfVar3 == (float *)0x0) {
      pfVar3 = *(float **)(lVar2 + 0x18);
    }
    return pfVar3;
  }
  __cxa_bad_cast();
}

Assistant:

const T&
  as() const
  {
    if (m_value == nullptr) {
        throw_or_mimic<exceptions::option_has_no_value>(
            m_long_names == nullptr ? "" : first_or_empty(*m_long_names));
    }

    return CXXOPTS_RTTI_CAST<const values::standard_value<T>&>(*m_value).get();
  }